

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.hpp
# Opt level: O2

SH<15> * operator+(SH<15> *__return_storage_ptr__,SH<15> *a,SH<15> *b)

{
  SH<15> *pSVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0;
  memset(__return_storage_ptr__,0,900);
  lVar2 = 4;
  pSVar1 = __return_storage_ptr__;
  while (lVar4 != 0xf) {
    lVar4 = lVar4 + 1;
    for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 4) {
      *(float *)((long)pSVar1->a + lVar3) =
           *(float *)((long)a->a + lVar3) + *(float *)((long)b->a + lVar3);
    }
    a = (SH<15> *)((long)a->a + lVar2);
    b = (SH<15> *)((long)b->a + lVar2);
    pSVar1 = (SH<15> *)((long)pSVar1->a + lVar2);
    lVar2 = lVar2 + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

SH<n> operator+(const SH<n>& a, const SH<n>& b)
{
    SH<n> c;
    for (int l=0; l<n; ++l)
        for (int m=-l; m<=l; ++m)
            c.at(l,m) = a.at(l,m) + b.at(l,m);
    return c;
}